

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

int xhtmlIsEmpty(xmlNodePtr node)

{
  xmlChar xVar1;
  int iVar2;
  xmlNodePtr node_local;
  
  if (node == (xmlNodePtr)0x0) {
    node_local._4_4_ = -1;
  }
  else if (node->type == XML_ELEMENT_NODE) {
    if ((node->ns == (xmlNs *)0x0) ||
       (iVar2 = xmlStrEqual(node->ns->href,(xmlChar *)"http://www.w3.org/1999/xhtml"), iVar2 != 0))
    {
      if (node->children == (_xmlNode *)0x0) {
        if (node->name == (xmlChar *)0x0) {
          xVar1 = '\0';
        }
        else {
          xVar1 = *node->name;
        }
        switch(xVar1) {
        case 'a':
          iVar2 = xmlStrEqual(node->name,"area");
          if (iVar2 == 0) {
            node_local._4_4_ = 0;
          }
          else {
            node_local._4_4_ = 1;
          }
          break;
        case 'b':
          iVar2 = xmlStrEqual(node->name,"br");
          if (iVar2 == 0) {
            iVar2 = xmlStrEqual(node->name,"base");
            if (iVar2 == 0) {
              iVar2 = xmlStrEqual(node->name,(xmlChar *)"basefont");
              if (iVar2 == 0) {
                node_local._4_4_ = 0;
              }
              else {
                node_local._4_4_ = 1;
              }
            }
            else {
              node_local._4_4_ = 1;
            }
          }
          else {
            node_local._4_4_ = 1;
          }
          break;
        case 'c':
          iVar2 = xmlStrEqual(node->name,"col");
          if (iVar2 == 0) {
            node_local._4_4_ = 0;
          }
          else {
            node_local._4_4_ = 1;
          }
          break;
        default:
          node_local._4_4_ = 0;
          break;
        case 'f':
          iVar2 = xmlStrEqual(node->name,"frame");
          if (iVar2 == 0) {
            node_local._4_4_ = 0;
          }
          else {
            node_local._4_4_ = 1;
          }
          break;
        case 'h':
          iVar2 = xmlStrEqual(node->name,(xmlChar *)"hr");
          if (iVar2 == 0) {
            node_local._4_4_ = 0;
          }
          else {
            node_local._4_4_ = 1;
          }
          break;
        case 'i':
          iVar2 = xmlStrEqual(node->name,(xmlChar *)"img");
          if (iVar2 == 0) {
            iVar2 = xmlStrEqual(node->name,"input");
            if (iVar2 == 0) {
              iVar2 = xmlStrEqual(node->name,(xmlChar *)"isindex");
              if (iVar2 == 0) {
                node_local._4_4_ = 0;
              }
              else {
                node_local._4_4_ = 1;
              }
            }
            else {
              node_local._4_4_ = 1;
            }
          }
          else {
            node_local._4_4_ = 1;
          }
          break;
        case 'l':
          iVar2 = xmlStrEqual(node->name,"link");
          if (iVar2 == 0) {
            node_local._4_4_ = 0;
          }
          else {
            node_local._4_4_ = 1;
          }
          break;
        case 'm':
          iVar2 = xmlStrEqual(node->name,(xmlChar *)"meta");
          if (iVar2 == 0) {
            node_local._4_4_ = 0;
          }
          else {
            node_local._4_4_ = 1;
          }
          break;
        case 'p':
          iVar2 = xmlStrEqual(node->name,(xmlChar *)"param");
          if (iVar2 == 0) {
            node_local._4_4_ = 0;
          }
          else {
            node_local._4_4_ = 1;
          }
        }
      }
      else {
        node_local._4_4_ = 0;
      }
    }
    else {
      node_local._4_4_ = 0;
    }
  }
  else {
    node_local._4_4_ = 0;
  }
  return node_local._4_4_;
}

Assistant:

static int
xhtmlIsEmpty(xmlNodePtr node) {
    if (node == NULL)
	return(-1);
    if (node->type != XML_ELEMENT_NODE)
	return(0);
    if ((node->ns != NULL) && (!xmlStrEqual(node->ns->href, XHTML_NS_NAME)))
	return(0);
    if (node->children != NULL)
	return(0);
    switch (node->name ? node->name[0] : 0) {
	case 'a':
	    if (xmlStrEqual(node->name, BAD_CAST "area"))
		return(1);
	    return(0);
	case 'b':
	    if (xmlStrEqual(node->name, BAD_CAST "br"))
		return(1);
	    if (xmlStrEqual(node->name, BAD_CAST "base"))
		return(1);
	    if (xmlStrEqual(node->name, BAD_CAST "basefont"))
		return(1);
	    return(0);
	case 'c':
	    if (xmlStrEqual(node->name, BAD_CAST "col"))
		return(1);
	    return(0);
	case 'f':
	    if (xmlStrEqual(node->name, BAD_CAST "frame"))
		return(1);
	    return(0);
	case 'h':
	    if (xmlStrEqual(node->name, BAD_CAST "hr"))
		return(1);
	    return(0);
	case 'i':
	    if (xmlStrEqual(node->name, BAD_CAST "img"))
		return(1);
	    if (xmlStrEqual(node->name, BAD_CAST "input"))
		return(1);
	    if (xmlStrEqual(node->name, BAD_CAST "isindex"))
		return(1);
	    return(0);
	case 'l':
	    if (xmlStrEqual(node->name, BAD_CAST "link"))
		return(1);
	    return(0);
	case 'm':
	    if (xmlStrEqual(node->name, BAD_CAST "meta"))
		return(1);
	    return(0);
	case 'p':
	    if (xmlStrEqual(node->name, BAD_CAST "param"))
		return(1);
	    return(0);
    }
    return(0);
}